

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O2

void test_regular(rtr_socket *socket)

{
  int iVar1;
  uint32_t sn;
  uint32_t sn_00;
  uint32_t sn_01;
  uint32_t sn_02;
  uint16_t in_SI;
  uint16_t uVar2;
  aspa_record *paVar3;
  rtr_socket *prVar4;
  size_t in_R8;
  long in_FS_OFFSET;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  aspa_record local_468;
  undefined4 local_450;
  undefined8 local_448;
  undefined8 *local_440;
  undefined4 local_438;
  undefined8 local_430;
  undefined8 *local_428;
  undefined4 local_420;
  undefined8 local_418;
  undefined1 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  aspa_record local_3c8;
  undefined4 local_3b0;
  undefined8 local_3a8;
  undefined8 *local_3a0;
  undefined4 local_398;
  undefined8 local_390;
  undefined8 *local_388;
  undefined4 local_380;
  undefined8 local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  update_callback local_338;
  undefined8 local_310;
  undefined4 local_308;
  undefined8 local_300;
  undefined8 *local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  undefined4 local_2e0;
  undefined8 local_2d8;
  undefined8 *local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined8 *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  uint32_t local_288 [16];
  aspa_record _records571 [4];
  uint32_t local_1e8 [4];
  update_callback _callbacks561 [1];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  uint32_t local_198 [12];
  aspa_record _records553 [3];
  uint32_t local_118 [12];
  update_callback _callbacks544 [3];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  begin_cache_response((uint8_t)socket,in_SI);
  local_48 = 0x44e0000044d;
  uStack_40 = 0x4500000044f;
  append_aspa('\x01','L',(uint32_t)&local_48,(uint32_t *)0x4,in_R8);
  local_58 = 0x44e0000044c;
  uStack_50 = 0x4500000044f;
  append_aspa('\x01','M',(uint32_t)&local_58,(uint32_t *)0x4,in_R8);
  local_68 = 0x89a00000899;
  uStack_60 = 0x89c0000089b;
  uVar2 = 0x898;
  append_aspa('\x01',0x98,(uint32_t)&local_68,(uint32_t *)0x4,in_R8);
  end_cache_response(0xb5,uVar2,sn);
  expected_callbacks = _callbacks544;
  _callbacks544[0].source = (aspa_table *)0x0;
  _callbacks544[0].record.customer_asn = 0x44c;
  _callbacks544[0].record.provider_count = 4;
  _callbacks544[0].record.provider_asns = local_118 + 8;
  local_118[8] = 0x44d;
  local_118[9] = 0x44e;
  local_118[10] = 0x44f;
  local_118[0xb] = 0x450;
  _callbacks544[0].type = ASPA_ADD;
  _callbacks544[1].source = (aspa_table *)0x0;
  _callbacks544[1].record.customer_asn = 0x44d;
  _callbacks544[1].record.provider_count = 4;
  _callbacks544[1].record.provider_asns = local_118 + 4;
  _callbacks544[1].type = ASPA_ADD;
  _callbacks544[2].source = (aspa_table *)0x0;
  local_118[4] = 0x44c;
  local_118[5] = 0x44e;
  local_118[6] = 0x44f;
  local_118[7] = 0x450;
  _callbacks544[2].record.customer_asn = 0x898;
  _callbacks544[2].record.provider_count = 4;
  _callbacks544[2].record.provider_asns = local_118;
  local_118[0] = 0x899;
  local_118[1] = 0x89a;
  local_118[2] = 0x89b;
  local_118[3] = 0x89c;
  _callbacks544[2].type = ASPA_ADD;
  callback_count = 3;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x222,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x223,"void test_regular(struct rtr_socket *)");
  }
  paVar3 = _records553;
  _records553[0].customer_asn = 0x44c;
  _records553[0].provider_count = 4;
  _records553[0].provider_asns = local_198 + 8;
  local_198[8] = 0x44d;
  local_198[9] = 0x44e;
  local_198[10] = 0x44f;
  local_198[0xb] = 0x450;
  _records553[1].customer_asn = 0x44d;
  _records553[1].provider_count = 4;
  _records553[1].provider_asns = local_198 + 4;
  local_198[4] = 0x44c;
  local_198[5] = 0x44e;
  local_198[6] = 0x44f;
  local_198[7] = 0x450;
  _records553[2].customer_asn = 0x898;
  _records553[2].provider_count = 4;
  _records553[2].provider_asns = local_198;
  local_198[0] = 0x899;
  local_198[1] = 0x89a;
  local_198[2] = 0x89b;
  local_198[3] = 0x89c;
  prVar4 = socket;
  assert_table(socket,paVar3,3);
  begin_cache_response((uint8_t)prVar4,(uint16_t)paVar3);
  local_1a8 = 0xce600000ce5;
  uStack_1a0 = 0xce800000ce7;
  uVar2 = 0xce4;
  append_aspa('\x01',0xe4,(uint32_t)&local_1a8,(uint32_t *)0x4,in_R8);
  end_cache_response(0xbc,uVar2,sn_00);
  expected_callbacks = _callbacks561;
  _callbacks561[0].source = (aspa_table *)0x0;
  _callbacks561[0].record.customer_asn = 0xce4;
  _callbacks561[0].record.provider_count = 4;
  _callbacks561[0].record.provider_asns = local_1e8;
  local_1e8[0] = 0xce5;
  local_1e8[1] = 0xce6;
  local_1e8[2] = 0xce7;
  local_1e8[3] = 0xce8;
  _callbacks561[0].type = ASPA_ADD;
  callback_count = 1;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x233,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x234,"void test_regular(struct rtr_socket *)");
  }
  paVar3 = _records571;
  _records571[0].customer_asn = 0x44c;
  _records571[0].provider_count = 4;
  _records571[0].provider_asns = local_288 + 0xc;
  local_288[0xc] = 0x44d;
  local_288[0xd] = 0x44e;
  local_288[0xe] = 0x44f;
  local_288[0xf] = 0x450;
  _records571[1].customer_asn = 0x44d;
  _records571[1].provider_count = 4;
  _records571[1].provider_asns = local_288 + 8;
  local_288[8] = 0x44c;
  local_288[9] = 0x44e;
  local_288[10] = 0x44f;
  local_288[0xb] = 0x450;
  _records571[2].customer_asn = 0x898;
  _records571[2].provider_count = 4;
  _records571[2].provider_asns = local_288 + 4;
  local_288[4] = 0x899;
  local_288[5] = 0x89a;
  local_288[6] = 0x89b;
  local_288[7] = 0x89c;
  _records571[3].customer_asn = 0xce4;
  _records571[3].provider_count = 4;
  _records571[3].provider_asns = local_288;
  local_288[0] = 0xce5;
  local_288[1] = 0xce6;
  local_288[2] = 0xce7;
  local_288[3] = 0xce8;
  prVar4 = socket;
  assert_table(socket,paVar3,4);
  begin_cache_response((uint8_t)prVar4,(uint16_t)paVar3);
  append_aspa('\0','L',0,(uint32_t *)0x0,in_R8);
  append_aspa('\0',0x98,0,(uint32_t *)0x0,in_R8);
  local_298 = 0x4b2000004b1;
  uStack_290 = 0x4b4000004b3;
  append_aspa('\x01','L',(uint32_t)&local_298,(uint32_t *)0x4,in_R8);
  uVar2 = 0;
  append_aspa('\x01','\0',0,(uint32_t *)0x0,in_R8);
  end_cache_response(0xbc,uVar2,sn_01);
  expected_callbacks = &local_338;
  local_338.source = (aspa_table *)0x0;
  local_338.record.customer_asn = 0;
  local_338.record.provider_count = 0;
  local_338.record.provider_asns = (uint32_t *)0x0;
  local_338.type = ASPA_ADD;
  local_310 = 0;
  local_308 = 0x44c;
  local_300 = 4;
  local_2f8 = &local_348;
  local_348 = 0x44e0000044d;
  uStack_340 = 0x4500000044f;
  local_2f0 = 0;
  local_2e8 = 0;
  local_2e0 = 0x44c;
  local_2d8 = 4;
  local_2d0 = &local_358;
  local_2c8 = 1;
  local_2c0 = 0;
  local_358 = 0x4b2000004b1;
  uStack_350 = 0x4b4000004b3;
  local_2b8 = 0x898;
  local_2b0 = 4;
  local_2a8 = &local_368;
  local_368 = 0x89a00000899;
  uStack_360 = 0x89c0000089b;
  local_2a0 = 0;
  callback_count = 4;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x24b,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index != callback_count) {
    __assert_fail("callback_index == callback_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x24c,"void test_regular(struct rtr_socket *)");
  }
  paVar3 = &local_3c8;
  local_3c8.customer_asn = 0;
  local_3c8.provider_count = 0;
  local_3c8.provider_asns = (uint32_t *)0x0;
  local_3b0 = 0x44c;
  local_3a8 = 4;
  local_3a0 = &local_3d8;
  local_3d8 = 0x4b2000004b1;
  uStack_3d0 = 0x4b4000004b3;
  local_398 = 0x44d;
  local_390 = 4;
  local_388 = &local_3e8;
  local_3e8 = 0x44e0000044c;
  uStack_3e0 = 0x4500000044f;
  local_380 = 0xce4;
  local_378 = 4;
  local_370 = &local_3f8;
  local_3f8 = 0xce600000ce5;
  uStack_3f0 = 0xce800000ce7;
  prVar4 = socket;
  assert_table(socket,paVar3,4);
  begin_cache_response((uint8_t)prVar4,(uint16_t)paVar3);
  local_408 = 0x4b2000004b1;
  uStack_400 = 0x4b4000004b3;
  append_aspa('\x01','m',(uint32_t)&local_408,(uint32_t *)0x4,in_R8);
  uVar2 = 0x76d;
  append_aspa('\0','m',0,(uint32_t *)0x0,in_R8);
  end_cache_response(0xbc,uVar2,sn_02);
  printf("Ignoring No-Ops!");
  expected_callbacks = (update_callback *)0x0;
  callback_count = 0;
  callback_index = 0;
  iVar1 = rtr_sync(socket);
  if (iVar1 != 0) {
    __assert_fail("rtr_sync(socket) == RTR_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                  ,0x266,"void test_regular(struct rtr_socket *)");
  }
  if (callback_index == callback_count) {
    local_468.customer_asn = 0;
    local_468.provider_count = 0;
    local_468.provider_asns = (uint32_t *)0x0;
    local_450 = 0x44c;
    local_448 = 4;
    local_440 = &local_478;
    local_478 = 0x4b2000004b1;
    uStack_470 = 0x4b4000004b3;
    local_438 = 0x44d;
    local_430 = 4;
    local_428 = &local_488;
    local_488 = 0x44e0000044c;
    uStack_480 = 0x4500000044f;
    local_420 = 0xce4;
    local_418 = 4;
    local_498 = 0xce600000ce5;
    uStack_490 = 0xce800000ce7;
    local_410 = (undefined1 *)&local_498;
    assert_table(socket,&local_468,4);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("callback_index == callback_count",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa.c"
                ,0x267,"void test_regular(struct rtr_socket *)");
}

Assistant:

static void test_regular(struct rtr_socket *socket)
{
	// Test: regular announcements and withdrawals
	// Expect: OK
	// DB: withdrawn records get removed, newly announced are added

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1101, 1102, 1103, 1104));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1101, ASNS(1100, 1102, 1103, 1104));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 2200, ASNS(2201, 2202, 2203, 2204));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 437);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
		ADDED(RECORD(1101, ASNS(1100, 1102, 1103, 1104))),
		ADDED(RECORD(2200, ASNS(2201, 2202, 2203, 2204))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1100, ASNS(1101, 1102, 1103, 1104)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(2200, ASNS(2201, 2202, 2203, 2204)),
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 3300, ASNS(3301, 3302, 3303, 3304));
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(3300, ASNS(3301, 3302, 3303, 3304))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(1100, ASNS(1101, 1102, 1103, 1104)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(2200, ASNS(2201, 2202, 2203, 2204)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304))
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 1100, ASNS());
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 2200, ASNS());
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1100, ASNS(1201, 1202, 1203, 1204));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 0, ASNS());
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(0, ASNS())),
		REMOVED(RECORD(1100, ASNS(1101, 1102, 1103, 1104))),
		ADDED(RECORD(1100, ASNS(1201, 1202, 1203, 1204))),
		REMOVED(RECORD(2200, ASNS(2201, 2202, 2203, 2204))),
	);

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(0, ASNS()),
		RECORD(1100, ASNS(1201, 1202, 1203, 1204)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304)),
	);

	begin_cache_response(RTR_PROTOCOL_VERSION_2, 0);
	// The following two are complementary (no-op)
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_ANNOUNCE, 1901, ASNS(1201, 1202, 1203, 1204));
	APPEND_ASPA(RTR_PROTOCOL_VERSION_2, ASPA_WITHDRAW, 1901, ASNS());
	end_cache_response(RTR_PROTOCOL_VERSION_2, 0, 444);

#if ASPA_NOTIFY_NO_OPS
	printf("Notifying No-Ops!");
	EXPECT_UPDATE_CALLBACKS(
		ADDED(RECORD(1901, ASNS(1201, 1202, 1203, 1204))),
		REMOVED(RECORD(1901, ASNS(1201, 1202, 1203, 1204))),
	);
#else
	printf("Ignoring No-Ops!");
	EXPECT_NO_UPDATE_CALLBACKS();
#endif

	assert(rtr_sync(socket) == RTR_SUCCESS);
	assert(callback_index == callback_count);

	ASSERT_TABLE(socket,
		RECORD(0, ASNS()),
		RECORD(1100, ASNS(1201, 1202, 1203, 1204)),
		RECORD(1101, ASNS(1100, 1102, 1103, 1104)),
		RECORD(3300, ASNS(3301, 3302, 3303, 3304)),
	);
}